

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Literal * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::ExternalInterface::load
          (Literal *__return_storage_ptr__,ExternalInterface *this,Load *load,Address addr,
          Name memory)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  undefined4 extraout_var_01;
  size_t sVar5;
  char *pcVar6;
  anon_union_16_5_9943fe1e_for_Literal_0 local_28;
  undefined8 local_18;
  
  pcVar6 = memory.super_IString.str._M_str;
  sVar5 = memory.super_IString.str._M_len;
  switch((load->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id) {
  case 0:
  case 1:
    ::wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
               ,0x96d);
  case 2:
    uVar1 = load->bytes;
    if (uVar1 == '\x04') {
      uVar2 = (*this->_vptr_ExternalInterface[0x11])(this,addr.addr,sVar5,pcVar6);
    }
    else if (uVar1 == '\x02') {
      if (load->signed_ == true) {
        iVar3 = (*this->_vptr_ExternalInterface[0xf])(this,addr.addr,sVar5,pcVar6);
        uVar2 = (uint)(short)iVar3;
      }
      else {
        uVar2 = (*this->_vptr_ExternalInterface[0x10])(this,addr.addr,sVar5,pcVar6);
        uVar2 = uVar2 & 0xffff;
      }
    }
    else {
      if (uVar1 != '\x01') {
        ::wasm::handle_unreachable
                  ("invalid size",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                   ,0x94f);
      }
      if (load->signed_ == true) {
        iVar3 = (*this->_vptr_ExternalInterface[0xd])(this,addr.addr,sVar5,pcVar6);
        uVar2 = (uint)(char)iVar3;
      }
      else {
        uVar2 = (*this->_vptr_ExternalInterface[0xe])(this,addr.addr,sVar5,pcVar6);
        uVar2 = uVar2 & 0xff;
      }
    }
    *(uint *)&__return_storage_ptr__->field_0 = uVar2;
    (__return_storage_ptr__->type).id = 2;
    break;
  case 3:
    switch(load->bytes) {
    case '\x01':
      if (load->signed_ == true) {
        iVar3 = (*this->_vptr_ExternalInterface[0xd])(this,addr.addr,sVar5,pcVar6);
        uVar4 = (ulong)(char)iVar3;
      }
      else {
        uVar2 = (*this->_vptr_ExternalInterface[0xe])(this,addr.addr,sVar5,pcVar6);
        uVar4 = (ulong)(uVar2 & 0xff);
      }
      break;
    case '\x02':
      if (load->signed_ == true) {
        iVar3 = (*this->_vptr_ExternalInterface[0xf])(this,addr.addr,sVar5,pcVar6);
        uVar4 = (ulong)(short)iVar3;
      }
      else {
        uVar2 = (*this->_vptr_ExternalInterface[0x10])(this,addr.addr,sVar5,pcVar6);
        uVar4 = (ulong)(uVar2 & 0xffff);
      }
      break;
    default:
      ::wasm::handle_unreachable
                ("invalid size",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                 ,0x961);
    case '\x04':
      if (load->signed_ == true) {
        iVar3 = (*this->_vptr_ExternalInterface[0x11])(this,addr.addr,sVar5,pcVar6);
        uVar4 = (ulong)iVar3;
      }
      else {
        uVar2 = (*this->_vptr_ExternalInterface[0x12])(this,addr.addr,sVar5,pcVar6);
        uVar4 = (ulong)uVar2;
      }
      break;
    case '\b':
      iVar3 = (*this->_vptr_ExternalInterface[0x13])(this,addr.addr,sVar5,pcVar6);
      uVar4 = CONCAT44(extraout_var_01,iVar3);
    }
    (__return_storage_ptr__->field_0).i64 = uVar4;
    (__return_storage_ptr__->type).id = 3;
    break;
  case 4:
    local_28.i32 = (*this->_vptr_ExternalInterface[0x12])(this,addr.addr,sVar5,pcVar6);
    local_18 = 2;
    ::wasm::Literal::castToF32();
    goto LAB_001801a6;
  case 5:
    iVar3 = (*this->_vptr_ExternalInterface[0x14])(this,addr.addr,sVar5,pcVar6);
    local_28.i64 = CONCAT44(extraout_var_00,iVar3);
    local_18 = 3;
    ::wasm::Literal::castToF64();
LAB_001801a6:
    ::wasm::Literal::~Literal((Literal *)&local_28.func);
    break;
  case 6:
    iVar3 = (*this->_vptr_ExternalInterface[0x15])
                      (this,addr.addr,(load->memory).super_IString.str._M_len,
                       (load->memory).super_IString.str._M_str);
    local_28.i64 = CONCAT44(extraout_var,iVar3);
    ::wasm::Literal::Literal(__return_storage_ptr__,local_28.v128);
    break;
  default:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  return __return_storage_ptr__;
}

Assistant:

virtual Literal load(Load* load, Address addr, Name memory) {
      switch (load->type.getBasic()) {
        case Type::i32: {
          switch (load->bytes) {
            case 1:
              return load->signed_ ? Literal((int32_t)load8s(addr, memory))
                                   : Literal((int32_t)load8u(addr, memory));
            case 2:
              return load->signed_ ? Literal((int32_t)load16s(addr, memory))
                                   : Literal((int32_t)load16u(addr, memory));
            case 4:
              return Literal((int32_t)load32s(addr, memory));
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::i64: {
          switch (load->bytes) {
            case 1:
              return load->signed_ ? Literal((int64_t)load8s(addr, memory))
                                   : Literal((int64_t)load8u(addr, memory));
            case 2:
              return load->signed_ ? Literal((int64_t)load16s(addr, memory))
                                   : Literal((int64_t)load16u(addr, memory));
            case 4:
              return load->signed_ ? Literal((int64_t)load32s(addr, memory))
                                   : Literal((int64_t)load32u(addr, memory));
            case 8:
              return Literal((int64_t)load64s(addr, memory));
            default:
              WASM_UNREACHABLE("invalid size");
          }
          break;
        }
        case Type::f32:
          return Literal(load32u(addr, memory)).castToF32();
        case Type::f64:
          return Literal(load64u(addr, memory)).castToF64();
        case Type::v128:
          return Literal(load128(addr, load->memory).data());
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      WASM_UNREACHABLE("invalid type");
    }